

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O1

uint8_t * uprv_aestrncpy_63(uint8_t *dst,uint8_t *src,int32_t n)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  uint8_t *__s;
  byte *pbVar5;
  
  if (n == -1) {
    sVar3 = strlen((char *)src);
    n = (int)sVar3 + 1;
  }
  bVar2 = *src;
  __s = dst;
  if (0 < n && bVar2 != 0) {
    pbVar5 = src + 1;
    uVar4 = n;
    do {
      *__s = ""[bVar2];
      __s = __s + 1;
      n = uVar4 - 1;
      bVar2 = *pbVar5;
      if (bVar2 == 0) break;
      pbVar5 = pbVar5 + 1;
      bVar1 = 1 < (int)uVar4;
      uVar4 = n;
    } while (bVar1);
  }
  if (0 < n) {
    memset(__s,0,(ulong)(uint)n);
  }
  return dst;
}

Assistant:

U_INTERNAL uint8_t* U_EXPORT2
uprv_aestrncpy(uint8_t *dst, const uint8_t *src, int32_t n)
{
  uint8_t *orig_dst = dst;

  if(n==-1) { 
    n = static_cast<int32_t>(uprv_strlen((const char*)src)+1); /* copy NUL */
  }
  /* copy non-null */
  while(*src && n>0) {
    *(dst++) = asciiFromEbcdic[*(src++)];
    n--;
  }
  /* pad */
  while(n>0) {
    *(dst++) = 0;
    n--;
  }
  return orig_dst;
}